

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iuutil::detail::
CmpHelperEqRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (AssertionResult *__return_storage_ptr__,detail *this,char *expected_expr,
          char *actual_expr,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> b1,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> e1,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> b2,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> e2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  char *local_c8;
  AssertionResult local_c0;
  undefined4 local_98;
  char *local_88;
  int *local_80;
  int *local_78;
  char *local_70;
  undefined1 local_68 [8];
  AssertionResult ar;
  char *actual_expr_local;
  char *expected_expr_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> e2_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> b2_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> e1_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> b1_local;
  
  expected_expr_local = b2._M_current;
  local_88 = b2._M_current;
  local_80 = e1._M_current;
  local_78 = b1._M_current;
  local_70 = actual_expr;
  ar._32_8_ = expected_expr;
  actual_expr_local = (char *)this;
  e2_local._M_current = (char *)e1._M_current;
  CmpHelperEqIterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            ((AssertionResult *)local_68,(iuutil *)actual_expr,b1,e1,b2,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             e1._M_current);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (bVar1) {
    iutest::AssertionSuccess();
  }
  else {
    iutest::AssertionFailure();
    pAVar2 = iutest::AssertionResult::operator<<(&local_c0,(char (*) [18])"error: Expected: ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&actual_expr_local);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [5])" == ");
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char **)&ar.m_result);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,(char (*) [12])" \n  Actual:");
    local_c8 = iutest::GetAssertionResultMessage((AssertionResult *)local_68);
    pAVar2 = iutest::AssertionResult::operator<<(pAVar2,&local_c8);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    iutest::AssertionResult::~AssertionResult(&local_c0);
  }
  local_98 = 1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqRange(const char* expected_expr, const char* actual_expr
    , T1 b1, T1 e1, T2 b2, T2 e2)
{
    if( ::iutest::AssertionResult ar = CmpHelperEqIterator(b1, e1, b2, e2) )
    {
        return ::iutest::AssertionSuccess();
    }
    else
    {
        return ::iutest::AssertionFailure() << "error: Expected: " << expected_expr << " == " << actual_expr
            << " \n  Actual:" << GetAssertionResultMessage(ar);
    }
}